

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

void do_slay(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  CHAR_DATA *ch_00;
  char *txt;
  char arg [4608];
  char local_1218 [4608];
  
  one_argument(argument,local_1218);
  if (local_1218[0] == '\0') {
    txt = "Slay whom?\n\r";
  }
  else {
    ch_00 = get_char_room(ch,local_1218);
    if (ch_00 == (CHAR_DATA *)0x0) {
      txt = "They aren\'t here.\n\r";
    }
    else if (ch_00 == ch) {
      txt = "Suicide is a mortal sin.\n\r";
    }
    else {
      bVar2 = is_npc(ch_00);
      if ((bVar2) || (sVar1 = ch_00->level, iVar3 = get_trust(ch), sVar1 < iVar3)) {
        act("You point at $M and $S heart stops!",ch,(void *)0x0,ch_00,3);
        act("$n points at you and your heart suddenly stops!",ch,(void *)0x0,ch_00,2);
        act("$n points at $N and $E falls over clenching $s chest!",ch,(void *)0x0,ch_00,1);
        raw_kill(ch,ch_00);
        return;
      }
      txt = "You failed.\n\r";
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_slay(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	char arg[MAX_INPUT_LENGTH];

	one_argument(argument, arg);
	if (arg[0] == '\0')
	{
		send_to_char("Slay whom?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch == victim)
	{
		send_to_char("Suicide is a mortal sin.\n\r", ch);
		return;
	}

	if (!is_npc(victim) && victim->level >= get_trust(ch))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	act("You point at $M and $S heart stops!", ch, nullptr, victim, TO_CHAR);
	act("$n points at you and your heart suddenly stops!", ch, nullptr, victim, TO_VICT);
	act("$n points at $N and $E falls over clenching $s chest!", ch, nullptr, victim, TO_NOTVICT);

	raw_kill(ch, victim);
}